

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O1

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateAddField
          (KotlinKMPGenerator *this,string *field_pos,FieldDef *field,CodeWriter *writer,
          IDLOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params;
  string signature;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> secondArg;
  string field_type;
  string local_f8;
  string local_d8;
  string local_b8;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_78 = field_pos;
  GenType_abi_cxx11_(&local_50,this,&(field->value).type);
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (&local_f8,&this->namer_,field,(ulong)(this->namer_).super_Namer.config_.variables);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_b8.field_2._M_allocated_capacity = *psVar3;
    local_b8.field_2._8_8_ = plVar2[3];
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar3;
    local_b8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_b8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b8,(ulong)local_50._M_dataplus._M_p);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_70.field_2._M_allocated_capacity = *psVar3;
    local_70.field_2._8_8_ = plVar2[3];
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar3;
    local_70._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_70._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"add","");
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  IdlNamer::LegacyKotlinMethod(&local_b8,&this->namer_,&local_f8,field,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_f8,"builder: FlatBufferBuilder, ",&local_70);
  if (field->key == true) {
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
    local_88 = (code *)0x0;
    pcStack_80 = (code *)0x0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_98._M_unused._M_object = operator_new(0x20);
    *(FieldDef **)local_98._M_unused._0_8_ = field;
    *(KotlinKMPGenerator **)((long)local_98._M_unused._0_8_ + 8) = this;
    *(CodeWriter **)((long)local_98._M_unused._0_8_ + 0x10) = writer;
    *(string **)((long)local_98._M_unused._0_8_ + 0x18) = local_78;
    pcStack_80 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:856:20)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:856:20)>
               ::_M_manager;
    GenerateFun(writer,&local_b8,&local_f8,&local_d8,(function<void_()> *)&local_98,
                options->gen_jvmstatic);
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
  }
  else {
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
    local_88 = (code *)0x0;
    pcStack_80 = (code *)0x0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_98._M_unused._M_object = operator_new(0x20);
    *(FieldDef **)local_98._M_unused._0_8_ = field;
    *(KotlinKMPGenerator **)((long)local_98._M_unused._0_8_ + 8) = this;
    *(CodeWriter **)((long)local_98._M_unused._0_8_ + 0x10) = writer;
    *(string **)((long)local_98._M_unused._0_8_ + 0x18) = local_78;
    pcStack_80 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:856:20)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:856:20)>
               ::_M_manager;
    GenerateFunOneLine(writer,&local_b8,&local_f8,&local_d8,(function<void_()> *)&local_98,
                       options->gen_jvmstatic);
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenerateAddField(std::string field_pos, FieldDef &field,
                        CodeWriter &writer, const IDLOptions options) const {
    auto field_type = GenType(field.value.type);
    auto secondArg = namer_.Variable(field.name) + ": " + field_type;

    auto content = [&]() {
      auto method = GenMethod(field.value.type);
      auto default_value = GenDefaultBufferValue(field);
      auto field_param = namer_.Field(field);
      if (IsEnum(field.value.type) || IsStruct(field.value.type)) {
        field_param += ".value";
      }

      writer.SetValue("field_name", namer_.Field(field));
      writer.SetValue("field_param", field_param);
      writer.SetValue("method_name", method);
      writer.SetValue("pos", field_pos);
      writer.SetValue("default", default_value);

      if (field.key) {
        // field has key attribute, so always need to exist
        // even if its value is equal to default.
        // Generated code will bypass default checking
        // resulting in { builder.addShort(name); slot(id); }
        writer += "builder.add{{method_name}}({{field_name}})";
        writer += "builder.slot({{pos}})";
      } else {
        writer += "builder.add{{method_name}}({{pos}}, \\";
        writer += "{{field_param}}, {{default}})";
      }
    };
    auto signature = namer_.LegacyKotlinMethod("add", field, "");
    auto params = "builder: FlatBufferBuilder, " + secondArg;
    if (field.key) {
      GenerateFun(writer, signature, params, "", content,
                  options.gen_jvmstatic);
    } else {
      GenerateFunOneLine(writer, signature, params, "", content,
                         options.gen_jvmstatic);
    }
  }